

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

MPP_RET hal_h264e_vepu541_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  RockchipSocType RVar2;
  MppEncHwCfg *hw;
  RockchipSocType soc_type;
  MPP_RET ret;
  HalH264eVepu541Ctx *p;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  cfg->type = VPU_CLIENT_RKVENC;
  hw._4_4_ = mpp_dev_init(&cfg->dev,cfg->type);
  if (hw._4_4_ == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    RVar2 = mpp_get_soc_type();
    if ((RVar2 == ROCKCHIP_SOC_RK3566) || (RVar2 == ROCKCHIP_SOC_RK3568)) {
      *(undefined4 *)((long)hal + 0x10) = 1;
    }
    else {
      *(undefined4 *)((long)hal + 0x10) = 0;
    }
    hw._4_4_ = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (hw._4_4_ == MPP_OK) {
      *(long *)((long)hal + 0x188) = (long)hal + 0x1b8;
      *(undefined8 *)((long)hal + 400) = *(undefined8 *)((long)hal + 8);
      *(undefined8 *)((long)hal + 0x198) = 0;
      *(long *)((long)hal + 0x1a0) = *hal + 0x1438;
      *(undefined8 *)((long)hal + 0x1a8) = 0;
      *(undefined8 *)((long)hal + 0x1b0) = 0;
      pMVar1 = cfg->cfg;
      (pMVar1->hw).qp_delta_row_i = 0;
      (pMVar1->hw).qp_delta_row = 2;
      (pMVar1->hw).qbias_i = 0x2ab;
      (pMVar1->hw).qbias_p = 0x155;
      (pMVar1->hw).qbias_en = 0;
      memcpy((pMVar1->hw).aq_thrd_i,h264_aq_tthd_default,0x40);
      memcpy((pMVar1->hw).aq_thrd_p,h264_aq_tthd_default,0x40);
      memcpy((pMVar1->hw).aq_step_i,h264_I_aq_step_default,0x40);
      memcpy((pMVar1->hw).aq_step_p,h264_P_aq_step_default,0x40);
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu541","init vepu buffer failed ret: %d\n","hal_h264e_vepu541_init",
                 (ulong)(uint)hw._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu541","mpp_dev_init failed. ret: %d\n","hal_h264e_vepu541_init",
               (ulong)(uint)hw._4_4_);
  }
  if (hw._4_4_ != MPP_OK) {
    hal_h264e_vepu541_deinit(hal);
  }
  h264e_vepu_stream_amend_init((HalH264eVepuStreamAmend *)((long)hal + 0x70));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_init",hal);
  }
  return hw._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu541_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu541Ctx *p = (HalH264eVepu541Ctx *)hal;
    MPP_RET ret = MPP_OK;

    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;

    {
        RockchipSocType soc_type = mpp_get_soc_type();

        if (soc_type == ROCKCHIP_SOC_RK3566 || soc_type == ROCKCHIP_SOC_RK3568)
            p->is_vepu540 = 1;
        else
            p->is_vepu540 = 0;
    }

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    p->osd_cfg.reg_base = &p->regs_set;
    p->osd_cfg.dev = p->dev;
    p->osd_cfg.reg_cfg = NULL;
    p->osd_cfg.plt_cfg = &p->cfg->plt_cfg;
    p->osd_cfg.osd_data = NULL;
    p->osd_cfg.osd_data2 = NULL;

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 0;
        hw->qp_delta_row    = 2;
        hw->qbias_i         = 683;
        hw->qbias_p         = 341;
        hw->qbias_en        = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));
    }

DONE:
    if (ret)
        hal_h264e_vepu541_deinit(hal);

    h264e_vepu_stream_amend_init(&p->amend);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}